

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

float ImGui::TableGetHeaderRowHeight(void)

{
  float fVar1;
  int iVar2;
  uint uVar3;
  ImGuiStyle *pIVar4;
  float lhs;
  undefined1 auVar5 [64];
  float in_stack_00000008;
  int column_n;
  int columns_count;
  float row_height;
  char *in_stack_00000018;
  undefined8 in_stack_ffffffffffffffec;
  int local_c;
  undefined1 extraout_var [56];
  
  lhs = GetTextLineHeight();
  iVar2 = TableGetColumnCount();
  for (local_c = 0; local_c < iVar2; local_c = local_c + 1) {
    uVar3 = TableGetColumnFlags((int)((ulong)in_stack_ffffffffffffffec >> 0x20));
    if ((uVar3 & 0x100000) != 0) {
      TableGetColumnName((int)lhs);
      auVar5._0_8_ = CalcTextSize(in_stack_00000018,_columns_count,column_n._3_1_,in_stack_00000008)
      ;
      auVar5._8_56_ = extraout_var;
      in_stack_ffffffffffffffec = vmovlpd_avx(auVar5._0_16_);
      lhs = ImMax<float>(lhs,(float)((ulong)in_stack_ffffffffffffffec >> 0x20));
    }
  }
  pIVar4 = GetStyle();
  fVar1 = (pIVar4->CellPadding).y;
  return fVar1 + fVar1 + lhs;
}

Assistant:

float ImGui::TableGetHeaderRowHeight()
{
    // Caring for a minor edge case:
    // Calculate row height, for the unlikely case that some labels may be taller than others.
    // If we didn't do that, uneven header height would highlight but smaller one before the tallest wouldn't catch input for all height.
    // In your custom header row you may omit this all together and just call TableNextRow() without a height...
    float row_height = GetTextLineHeight();
    int columns_count = TableGetColumnCount();
    for (int column_n = 0; column_n < columns_count; column_n++)
        if (TableGetColumnFlags(column_n) & ImGuiTableColumnFlags_IsEnabled)
            row_height = ImMax(row_height, CalcTextSize(TableGetColumnName(column_n)).y);
    row_height += GetStyle().CellPadding.y * 2.0f;
    return row_height;
}